

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O0

void __thiscall
mp::internal::AffineExprExtractor::VisitCommonExpr(AffineExprExtractor *this,Reference e)

{
  bool bVar1;
  pointer pTVar2;
  int in_EDX;
  char *in_RSI;
  BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_RDI;
  CommonExpr CVar3;
  const_iterator end;
  const_iterator i;
  LinearExpr *linear;
  CommonExpr common_expr;
  BasicExprVisitor<mp::internal::AffineExprExtractor,_void,_mp::internal::ExprTypes>
  *in_stack_00000408;
  ExprBase in_stack_00000410;
  LinearExpr *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  ExprBase other;
  undefined8 in_stack_ffffffffffffffa8;
  AffineExprExtractor *in_stack_ffffffffffffffb0;
  small_vector_iterator<const_mp::LinearExpr::Term_*,_long> local_40;
  LinearExpr *local_38;
  BasicProblem<mp::BasicProblemParams<int>_> *local_30;
  int local_28;
  BasicProblem<mp::BasicProblemParams<int>_> *local_20;
  int local_18;
  Reference local_8;
  
  other.impl_ = (Impl *)**(undefined8 **)
                          &(in_RDI->
                           super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                           ).index_;
  Reference::index(&local_8,in_RSI,in_EDX);
  CVar3 = BasicProblem<mp::BasicProblemParams<int>_>::common_expr
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)other.impl_,
                     (int)((ulong)in_RDI >> 0x20));
  local_30 = CVar3.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
             problem_;
  local_28 = CVar3.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
             index_;
  local_20 = local_30;
  local_18 = local_28;
  local_38 = BasicProblem<mp::BasicProblemParams<int>_>::
             BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
             ::linear_expr((BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                            *)0x1c65cf);
  local_40.m_ptr = (Term *)LinearExpr::begin(in_stack_ffffffffffffff88);
  LinearExpr::end(in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = gch::operator!=((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            (small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)
                            in_stack_ffffffffffffff88);
    if (!bVar1) break;
    pTVar2 = gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator->
                       ((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)0x1c6611);
    in_stack_ffffffffffffff94 = LinearExpr::Term::var_index(pTVar2);
    pTVar2 = gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator->
                       ((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)0x1c6627);
    LinearExpr::Term::coef(pTVar2);
    AddTerm(in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
            (double)other.impl_);
    gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator++(&local_40);
  }
  BasicProblem<mp::BasicProblemParams<int>_>::
  BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  ::nonlinear_expr(in_RDI);
  BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_RDI,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)other.impl_,in_stack_ffffffffffffff94
            );
  BasicExprVisitor<mp::internal::AffineExprExtractor,_void,_mp::internal::ExprTypes>::Visit
            (in_stack_00000408,(Expr)in_stack_00000410.impl_);
  return;
}

Assistant:

void AffineExprExtractor::VisitCommonExpr(Reference e) {
  auto common_expr = sp_.problem_.common_expr(e.index());
  const auto &linear = common_expr.linear_expr();
  for (auto i = linear.begin(), end = linear.end(); i != end; ++i)
    AddTerm(i->var_index(), i->coef());
  Visit(common_expr.nonlinear_expr());
}